

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameplayDisplayer.cpp
# Opt level: O2

void __thiscall GameplayDisplayer::drawPause(GameplayDisplayer *this,GLfloat width)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  GLfloat GVar4;
  float pixelSize;
  
  GVar4 = PrimitiveDisplayer::getPixelsPerSquare(this->primitiveDisplayer);
  iVar2 = (int)(GVar4 * 0.5);
  glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3ecccccd);
  glPushMatrix();
  glTranslatef(width - (float)(iVar2 * 3),(float)(iVar2 * 2),0);
  pixelSize = (float)(int)(GVar4 * 0.5);
  iVar1 = 4;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    PrimitiveDisplayer::drawSquare(this->primitiveDisplayer,pixelSize);
    glTranslatef(0,pixelSize,0);
  }
  glTranslatef((float)(iVar2 * -2),(float)(iVar2 * -4),0);
  iVar1 = 4;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    PrimitiveDisplayer::drawSquare(this->primitiveDisplayer,pixelSize);
    glTranslatef(0,pixelSize,0);
  }
  glPopMatrix();
  return;
}

Assistant:

void GameplayDisplayer::drawPause(GLfloat width) {
    GLint smallSize = primitiveDisplayer->getPixelsPerSquare() / 2;
    GLint pauseHeight = 4;
    
    glColor4f(1.0f, 1.0f, 1.0f, 0.4f);
    
    glPushMatrix();
        glTranslatef(width - smallSize * 3, smallSize * 2, 0.0f);
        for (int i=0; i < pauseHeight; i++) {
            primitiveDisplayer->drawSquare(smallSize);
            glTranslatef(0.0f, smallSize, 0.0f);
        }

        glTranslatef(-2*smallSize, -pauseHeight * smallSize, 0.0f);
        for (int i=0; i < pauseHeight; i++) {
            primitiveDisplayer->drawSquare(smallSize);
            glTranslatef(0.0f, smallSize, 0.0f);
        }
    glPopMatrix();
}